

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

bool CheckDataDirOption(ArgsManager *args)

{
  char cVar1;
  long in_FS_OFFSET;
  bool bVar2;
  path datadir;
  string in_stack_ffffffffffffff38;
  long *local_a0 [2];
  long local_90 [2];
  path local_80;
  path local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"-datadir","");
  local_58._M_pathname.field_2._M_allocated_capacity = 0;
  local_58._M_pathname.field_2._8_8_ = 0;
  local_58._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_58._M_pathname._M_string_length = 0;
  local_58._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&local_58);
  ArgsManager::GetPathArg((path *)&local_80,args,in_stack_ffffffffffffff38,(path *)local_a0);
  std::filesystem::__cxx11::path::~path(&local_58);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  if (local_80._M_pathname._M_string_length == 0) {
    bVar2 = true;
  }
  else {
    std::filesystem::absolute((path *)&local_58);
    std::filesystem::__cxx11::path::path((path *)&stack0xffffffffffffff38,&local_58);
    std::filesystem::__cxx11::path::~path(&local_58);
    cVar1 = std::filesystem::status((path *)&stack0xffffffffffffff38);
    bVar2 = cVar1 == '\x02';
    std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff38);
  }
  std::filesystem::__cxx11::path::~path(&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool CheckDataDirOption(const ArgsManager& args)
{
    const fs::path datadir{args.GetPathArg("-datadir")};
    return datadir.empty() || fs::is_directory(fs::absolute(datadir));
}